

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IStreamingReporter * __thiscall
Catch::ReporterRegistry::create(ReporterRegistry *this,string *name,Ptr<Catch::IConfig> *config)

{
  bool bVar1;
  pointer ppVar2;
  const_iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>_>
  *in_stack_ffffffffffffff88;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>
  *in_stack_ffffffffffffff90;
  ReporterConfig *this_00;
  undefined1 local_40 [16];
  _Self local_30;
  _Self local_28 [4];
  IStreamingReporter *local_8;
  
  local_28[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>_>
       ::find(in_stack_ffffffffffffff88,(key_type *)0x1acc8b);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>_>
       ::end(in_stack_ffffffffffffff88);
  bVar1 = std::operator==(local_28,&local_30);
  if (bVar1) {
    local_8 = (IStreamingReporter *)0x0;
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>
             ::operator->(in_stack_ffffffffffffff90);
    this_00 = (ReporterConfig *)ppVar2->second;
    ReporterConfig::ReporterConfig(this_00,(Ptr<Catch::IConfig> *)in_stack_ffffffffffffff88);
    local_8 = (IStreamingReporter *)(**(code **)(this_00->m_stream + 0x10))(this_00,local_40);
    ReporterConfig::~ReporterConfig((ReporterConfig *)0x1acd18);
  }
  return local_8;
}

Assistant:

virtual IStreamingReporter* create( std::string const& name, Ptr<IConfig> const& config ) const {
            FactoryMap::const_iterator it =  m_factories.find( name );
            if( it == m_factories.end() )
                return NULL;
            return it->second->create( ReporterConfig( config ) );
        }